

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  socket_t sock;
  size_t sVar1;
  uint uVar2;
  unsigned_long *puVar3;
  SocketStream *pSVar4;
  char *pcVar5;
  undefined4 in_register_00000034;
  ssize_t n;
  size_t remaining_size;
  SocketStream *local_28;
  size_t size_local;
  char *ptr_local;
  SocketStream *this_local;
  
  size_local = CONCAT44(in_register_00000034,__fd);
  local_28 = (SocketStream *)__buf;
  ptr_local = (char *)this;
  remaining_size = std::numeric_limits<long>::max();
  puVar3 = std::min<unsigned_long>((unsigned_long *)&local_28,&remaining_size);
  sVar1 = size_local;
  local_28 = (SocketStream *)*puVar3;
  if (this->read_buff_off_ < this->read_buff_content_size_) {
    pSVar4 = (SocketStream *)(this->read_buff_content_size_ - this->read_buff_off_);
    if (pSVar4 < local_28) {
      pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->read_buff_);
      memcpy((void *)sVar1,pcVar5 + this->read_buff_off_,(size_t)pSVar4);
      this->read_buff_off_ = (long)&(pSVar4->super_Stream)._vptr_Stream + this->read_buff_off_;
      this_local = pSVar4;
    }
    else {
      pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->read_buff_);
      memcpy((void *)sVar1,pcVar5 + this->read_buff_off_,(size_t)local_28);
      this->read_buff_off_ = (long)&(local_28->super_Stream)._vptr_Stream + this->read_buff_off_;
      this_local = local_28;
    }
  }
  else {
    uVar2 = (*(this->super_Stream)._vptr_Stream[2])();
    if ((uVar2 & 1) == 0) {
      this_local = (SocketStream *)0xffffffffffffffff;
    }
    else {
      this->read_buff_off_ = 0;
      this->read_buff_content_size_ = 0;
      if (local_28 < (SocketStream *)0x1000) {
        sock = this->sock_;
        pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->read_buff_);
        pSVar4 = (SocketStream *)read_socket(sock,pcVar5,0x1000,0);
        sVar1 = size_local;
        this_local = pSVar4;
        if (0 < (long)pSVar4) {
          if ((long)local_28 < (long)pSVar4) {
            pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->read_buff_);
            memcpy((void *)sVar1,pcVar5,(size_t)local_28);
            this->read_buff_off_ = (size_t)local_28;
            this->read_buff_content_size_ = (size_t)pSVar4;
            this_local = local_28;
          }
          else {
            pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->read_buff_);
            memcpy((void *)sVar1,pcVar5,(size_t)pSVar4);
          }
        }
      }
      else {
        this_local = (SocketStream *)read_socket(this->sock_,(void *)size_local,(size_t)local_28,0);
      }
    }
  }
  return (ssize_t)this_local;
}

Assistant:

inline ssize_t SocketStream::read(char *ptr, size_t size) {
#ifdef _WIN32
  size =
      (std::min)(size, static_cast<size_t>((std::numeric_limits<int>::max)()));
#else
  size = (std::min)(size,
                    static_cast<size_t>((std::numeric_limits<ssize_t>::max)()));
#endif

  if (read_buff_off_ < read_buff_content_size_) {
    auto remaining_size = read_buff_content_size_ - read_buff_off_;
    if (size <= remaining_size) {
      memcpy(ptr, read_buff_.data() + read_buff_off_, size);
      read_buff_off_ += size;
      return static_cast<ssize_t>(size);
    } else {
      memcpy(ptr, read_buff_.data() + read_buff_off_, remaining_size);
      read_buff_off_ += remaining_size;
      return static_cast<ssize_t>(remaining_size);
    }
  }

  if (!is_readable()) { return -1; }

  read_buff_off_ = 0;
  read_buff_content_size_ = 0;

  if (size < read_buff_size_) {
    auto n = read_socket(sock_, read_buff_.data(), read_buff_size_,
                         CPPHTTPLIB_RECV_FLAGS);
    if (n <= 0) {
      return n;
    } else if (n <= static_cast<ssize_t>(size)) {
      memcpy(ptr, read_buff_.data(), static_cast<size_t>(n));
      return n;
    } else {
      memcpy(ptr, read_buff_.data(), size);
      read_buff_off_ = size;
      read_buff_content_size_ = static_cast<size_t>(n);
      return static_cast<ssize_t>(size);
    }
  } else {
    return read_socket(sock_, ptr, size, CPPHTTPLIB_RECV_FLAGS);
  }
}